

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

void LZ4_renormDictT(LZ4_stream_t_internal *LZ4_dict,int nextSize)

{
  uint uVar1;
  LZ4_byte *pLVar2;
  uint uVar3;
  long lVar4;
  LZ4_u32 LVar5;
  
  if (0x80000000 < nextSize + LZ4_dict->currentOffset) {
    uVar3 = LZ4_dict->currentOffset - 0x10000;
    pLVar2 = LZ4_dict->dictionary;
    uVar1 = LZ4_dict->dictSize;
    lVar4 = 0;
    do {
      LVar5 = LZ4_dict->hashTable[lVar4] - uVar3;
      if (LZ4_dict->hashTable[lVar4] < uVar3) {
        LVar5 = 0;
      }
      LZ4_dict->hashTable[lVar4] = LVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x1000);
    LZ4_dict->currentOffset = 0x10000;
    if (0x10000 < LZ4_dict->dictSize) {
      LZ4_dict->dictSize = 0x10000;
    }
    LZ4_dict->dictionary = pLVar2 + ((ulong)uVar1 - (ulong)LZ4_dict->dictSize);
  }
  return;
}

Assistant:

static void LZ4_renormDictT(LZ4_stream_t_internal* LZ4_dict, int nextSize)
{
    assert(nextSize >= 0);
    if (LZ4_dict->currentOffset + (unsigned)nextSize > 0x80000000) {   /* potential ptrdiff_t overflow (32-bits mode) */
        /* rescale hash table */
        U32 const delta = LZ4_dict->currentOffset - 64 KB;
        const BYTE* dictEnd = LZ4_dict->dictionary + LZ4_dict->dictSize;
        int i;
        DEBUGLOG(4, "LZ4_renormDictT");
        for (i=0; i<LZ4_HASH_SIZE_U32; i++) {
            if (LZ4_dict->hashTable[i] < delta) LZ4_dict->hashTable[i]=0;
            else LZ4_dict->hashTable[i] -= delta;
        }
        LZ4_dict->currentOffset = 64 KB;
        if (LZ4_dict->dictSize > 64 KB) LZ4_dict->dictSize = 64 KB;
        LZ4_dict->dictionary = dictEnd - LZ4_dict->dictSize;
    }
}